

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BLBackTrace.cpp
# Opt level: O2

void __thiscall amrex::BLBTer::BLBTer(BLBTer *this,string *s,char *file,int line)

{
  ostream *poVar1;
  ostringstream ss0;
  ostringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_350;
  string local_310 [376];
  ostringstream local_198 [376];
  
  (this->line_file)._M_dataplus._M_p = (pointer)&(this->line_file).field_2;
  (this->line_file)._M_string_length = 0;
  (this->line_file).field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"Line ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,line);
  poVar1 = std::operator<<(poVar1,", File ");
  std::operator<<(poVar1,file);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)this,local_310);
  std::__cxx11::string::~string(local_310);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_310);
  poVar1 = std::operator<<((ostream *)local_310,"Proc. ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(ParallelContext::frames + 0xc));
  poVar1 = std::operator<<(poVar1,": \"");
  poVar1 = std::operator<<(poVar1,(string *)s);
  std::operator<<(poVar1,"\"");
  std::__cxx11::stringbuf::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_350,&local_370,&this->line_file);
  std::
  deque<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((deque<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              *)BLBackTrace::bt_stack_abi_cxx11_,&local_350);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_350);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_310);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

BLBTer::BLBTer(const std::string& s, const char* file, int line)
{
    std::ostringstream ss;
    ss << "Line " << line << ", File " << file;
    line_file = ss.str();

#ifdef AMREX_USE_OMP
    if (omp_in_parallel()) {
        std::ostringstream ss0;
        ss0 << "Proc. " << ParallelDescriptor::MyProc()
            << ", Thread " << omp_get_thread_num()
            << ": \"" << s << "\"";
        BLBackTrace::bt_stack.push(std::make_pair(ss0.str(), line_file));
    }
    else {
        #pragma omp parallel
        {
            std::ostringstream ss0;
            ss0 << "Proc. " << ParallelDescriptor::MyProc()
                << ", Master Thread"
                << ": \"" << s << "\"";
            BLBackTrace::bt_stack.push(std::make_pair(ss0.str(), line_file));
        }
    }
#else
    std::ostringstream ss0;
    ss0 << "Proc. " << ParallelDescriptor::MyProc()
        << ": \"" << s << "\"";
    BLBackTrace::bt_stack.push(std::make_pair(ss0.str(), line_file));
#endif
}